

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall DStrifeStatusBar::DrawMainBar(DStrifeStatusBar *this)

{
  int iVar1;
  APlayerPawn *this_00;
  DFrameBuffer *this_01;
  bool bVar2;
  int iVar3;
  FTexture *pFVar4;
  PClassActor *type;
  AInventory *pAVar5;
  AInventory *pAVar6;
  int local_54;
  int local_38;
  int local_34;
  int ammocount2;
  int ammocount1;
  AAmmo *ammo2;
  AAmmo *ammo1;
  ABasicArmor *pAStack_18;
  int i;
  AInventory *item;
  DStrifeStatusBar *this_local;
  
  item = (AInventory *)this;
  if ((this->CurrentPop != 0) && (this->PopHeight < 0)) {
    if (((this->super_DBaseStatusBar).Scaled & 1U) == 0) {
      local_54 = (this->super_DBaseStatusBar).ST_Y + -8;
    }
    else {
      iVar1 = (this->super_DBaseStatusBar).ST_Y;
      iVar3 = DCanvas::GetHeight((DCanvas *)screen);
      local_54 = ((iVar1 + -8) * iVar3) / 200;
    }
    DrawPopScreen(this,local_54);
  }
  pFVar4 = FImageCollection::operator[](&this->Images,2);
  DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,0,0,(FRemapTable *)0x0);
  pFVar4 = FImageCollection::operator[](&this->Images,3);
  DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,0,-8,(FRemapTable *)0x0);
  DrINumber(this,((this->super_DBaseStatusBar).CPlayer)->health,0x4f,-6,8);
  if ((((this->super_DBaseStatusBar).CPlayer)->cheats & 2U) == 0) {
    FHealthBar::SetVial(&this->HealthBar,((this->super_DBaseStatusBar).CPlayer)->health);
  }
  else {
    FHealthBar::SetVial(&this->HealthBar,999);
  }
  DBaseStatusBar::DrawImage
            (&this->super_DBaseStatusBar,&(this->HealthBar).super_FTexture,0x31,4,(FRemapTable *)0x0
            );
  DBaseStatusBar::DrawImage
            (&this->super_DBaseStatusBar,&(this->HealthBar).super_FTexture,0x31,7,(FRemapTable *)0x0
            );
  pAStack_18 = AActor::FindInventory<ABasicArmor>
                         (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
  if ((pAStack_18 != (ABasicArmor *)0x0) && (0 < (pAStack_18->super_AArmor).super_AInventory.Amount)
     ) {
    ammo1._0_4_ = (pAStack_18->super_AArmor).super_AInventory.Icon.texnum;
    pFVar4 = FTextureManager::operator()(&TexMan,ammo1._0_4_,false);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,2,9,(FRemapTable *)0x0);
    DrINumber(this,(pAStack_18->super_AArmor).super_AInventory.Amount,0x1b,0x17,0x13);
  }
  DBaseStatusBar::GetCurrentAmmo
            (&this->super_DBaseStatusBar,&ammo2,(AAmmo **)&ammocount2,&local_34,&local_38);
  if (ammo2 != (AAmmo *)0x0) {
    DrINumber(this,(ammo2->super_AInventory).Amount,0x137,-6,8);
    pFVar4 = FTextureManager::operator()
                       (&TexMan,(FTextureID)(ammo2->super_AInventory).Icon.texnum,false);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,0x122,0xd,(FRemapTable *)0x0);
  }
  this_00 = ((this->super_DBaseStatusBar).CPlayer)->mo;
  type = PClass::FindActor(NAME_Sigil);
  pAStack_18 = (ABasicArmor *)AActor::FindInventory(&this_00->super_AActor,type,false);
  if (pAStack_18 != (ABasicArmor *)0x0) {
    pFVar4 = FTextureManager::operator()
                       (&TexMan,(FTextureID)(((AInventory *)pAStack_18)->Icon).texnum,false);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,0xfd,7,(FRemapTable *)0x0);
  }
  ((this->super_DBaseStatusBar).CPlayer)->inventorytics = 0;
  pAVar5 = DBaseStatusBar::ValidateInvFirst(&this->super_DBaseStatusBar,6);
  TObjPtr<AInventory>::operator=(&((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst,pAVar5);
  pAStack_18 = (ABasicArmor *)
               ::TObjPtr::operator_cast_to_AInventory_
                         ((TObjPtr *)&((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst);
  for (ammo1._4_4_ = 0; pAVar5 = (AInventory *)pAStack_18,
      pAStack_18 != (ABasicArmor *)0x0 && ammo1._4_4_ < 6; ammo1._4_4_ = ammo1._4_4_ + 1) {
    pAVar6 = ::TObjPtr::operator_cast_to_AInventory_
                       ((TObjPtr *)&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
    this_01 = screen;
    if (pAVar5 == pAVar6) {
      pFVar4 = FImageCollection::operator[](&this->Images,this->CursorImage);
      DCanvas::DrawTexture
                ((DCanvas *)this_01,pFVar4,
                 (double)(ammo1._4_4_ * 0x23 + 0x2a +
                         *(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24),
                 (double)((this->super_DBaseStatusBar).ST_Y + 0xc),0x40001392,1.0 - this->ItemFlash,
                 (ulong)((this->super_DBaseStatusBar).Scaled & 1),0x4000138c,0);
    }
    bVar2 = FTextureID::isValid(&((AInventory *)pAStack_18)->Icon);
    if (bVar2) {
      pFVar4 = FTextureManager::operator()
                         (&TexMan,(FTextureID)(((AInventory *)pAStack_18)->Icon).texnum,false);
      DBaseStatusBar::DrawDimImage
                (&this->super_DBaseStatusBar,pFVar4,ammo1._4_4_ * 0x23 + 0x30,0xe,
                 ((AInventory *)pAStack_18)->Amount < 1);
    }
    DrINumber(this,((AInventory *)pAStack_18)->Amount,ammo1._4_4_ * 0x23 + 0x4a,0x17,0x13);
    pAStack_18 = (ABasicArmor *)AInventory::NextInv((AInventory *)pAStack_18);
  }
  return;
}

Assistant:

void DrawMainBar ()
	{
		AInventory *item;
		int i;

		// Pop screen (log, keys, and status)
		if (CurrentPop != POP_None && PopHeight < 0)
		{
			DrawPopScreen (Scaled ? (ST_Y - 8) * screen->GetHeight() / 200 : ST_Y - 8);
		}

		DrawImage (Images[imgINVBACK], 0, 0);
		DrawImage (Images[imgINVTOP], 0, -8);

		// Health
		DrINumber (CPlayer->health, 79, -6, imgFONG0);
		if (CPlayer->cheats & CF_GODMODE)
		{
			HealthBar.SetVial (999);
		}
		else
		{
			HealthBar.SetVial (CPlayer->health);
		}
		DrawImage (&HealthBar, 49, 4);
		DrawImage (&HealthBar, 49, 7);

		// Armor
		item = CPlayer->mo->FindInventory<ABasicArmor>();
		if (item != NULL && item->Amount > 0)
		{
			DrawImage (TexMan(item->Icon), 2, 9);
			DrINumber (item->Amount, 27, 23, imgFONY0);
		}

		// Ammo
		AAmmo *ammo1, *ammo2;
		int ammocount1, ammocount2;

		GetCurrentAmmo (ammo1, ammo2, ammocount1, ammocount2);
		if (ammo1 != NULL)
		{
			DrINumber (ammo1->Amount, 311, -6, imgFONG0);
			DrawImage (TexMan(ammo1->Icon), 290, 13);
			if (ammo2 != NULL)
			{
/*				int y = MIN (-5 - BigHeight, -5 - TexMan(ammo1->Icon)->GetHeight());
				screen->DrawTexture (TexMan(ammo2->Icon), -14, y,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					TAG_DONE);
				DrBNumberOuterFont (ammo2->Amount, -67, y - BigHeight);
*/			}
		}

		// Sigil
		item = CPlayer->mo->FindInventory(PClass::FindActor(NAME_Sigil));
		if (item != NULL)
		{
			DrawImage (TexMan(item->Icon), 253, 7);
		}

		// Inventory
		CPlayer->inventorytics = 0;
		CPlayer->mo->InvFirst = ValidateInvFirst (6);
		for (item = CPlayer->mo->InvFirst, i = 0; item != NULL && i < 6; item = item->NextInv(), ++i)
		{
			if (item == CPlayer->mo->InvSel)
			{
				screen->DrawTexture (Images[CursorImage],
					42 + 35*i + ST_X, 12 + ST_Y,
					DTA_Bottom320x200, Scaled,
					DTA_AlphaF, 1. - ItemFlash,
					TAG_DONE);
			}
			if (item->Icon.isValid())
			{
				DrawDimImage (TexMan(item->Icon), 48 + 35*i, 14, item->Amount <= 0);
			}
			DrINumber (item->Amount, 74 + 35*i, 23, imgFONY0);
		}
	}